

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::ScanLineInputFile::ScanLineInputFile(ScanLineInputFile *this,char *filename,int numThreads)

{
  ContextInitializer *in_RDI;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 local_90 [28];
  int in_stack_ffffffffffffff8c;
  ContextInitializer *in_stack_ffffffffffffff90;
  exr_read_func_ptr_t in_stack_ffffffffffffff98;
  ScanLineInputFile *in_stack_ffffffffffffffa0;
  
  memset(local_90,0,0x78);
  ContextInitializer::ContextInitializer((ContextInitializer *)local_90);
  ContextInitializer::silentHeaderParse(in_RDI,(bool)in_stack_ffffffffffffff5f);
  ContextInitializer::strictHeaderValidation(in_RDI,(bool)in_stack_ffffffffffffff5f);
  ScanLineInputFile(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                    in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  return;
}

Assistant:

ScanLineInputFile::ScanLineInputFile (const char filename[], int numThreads)
    : ScanLineInputFile (
        filename,
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false),
        numThreads)
{
}